

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterTests.cpp
# Opt level: O3

void addMeanSquareError<CoreML::Specification::NeuralNetworkClassifier>
               (Model *m,NeuralNetworkClassifier *nn,char *lossName,char *mseInputName,
               char *targetName)

{
  int iVar1;
  ulong uVar2;
  Rep *pRVar3;
  NetworkUpdateParameters *pNVar4;
  LossLayer *pLVar5;
  MeanSquaredErrorLossLayer *pMVar6;
  LogMessage *other;
  FeatureDescription *pFVar7;
  undefined8 *puVar8;
  Arena *pAVar9;
  ModelDescription *pMVar10;
  FeatureDescription output;
  LogFinisher local_99;
  FeatureDescription local_98;
  LogMessage local_68;
  
  pNVar4 = nn->updateparams_;
  if (pNVar4 == (NetworkUpdateParameters *)0x0) {
    uVar2 = (nn->super_MessageLite)._internal_metadata_.ptr_;
    pAVar9 = (Arena *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      pAVar9 = *(Arena **)pAVar9;
    }
    pNVar4 = google::protobuf::Arena::
             CreateMaybeMessage<CoreML::Specification::NetworkUpdateParameters>(pAVar9);
    nn->updateparams_ = pNVar4;
  }
  pRVar3 = (pNVar4->losslayers_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_0019f149:
    pLVar5 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::LossLayer>
                       ((pNVar4->losslayers_).super_RepeatedPtrFieldBase.arena_);
    pLVar5 = (LossLayer *)
             google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                       (&(pNVar4->losslayers_).super_RepeatedPtrFieldBase,pLVar5);
  }
  else {
    iVar1 = (pNVar4->losslayers_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar1) goto LAB_0019f149;
    (pNVar4->losslayers_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
    pLVar5 = (LossLayer *)pRVar3->elements[iVar1];
  }
  uVar2 = (pLVar5->super_MessageLite)._internal_metadata_.ptr_;
  puVar8 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
  if ((uVar2 & 1) != 0) {
    puVar8 = (undefined8 *)*puVar8;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pLVar5->name_,lossName,puVar8);
  if (pLVar5->_oneof_case_[0] == 0xb) {
    pMVar6 = (MeanSquaredErrorLossLayer *)(pLVar5->LossLayerType_).categoricalcrossentropylosslayer_
    ;
  }
  else {
    CoreML::Specification::LossLayer::clear_LossLayerType(pLVar5);
    pLVar5->_oneof_case_[0] = 0xb;
    uVar2 = (pLVar5->super_MessageLite)._internal_metadata_.ptr_;
    pAVar9 = (Arena *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      pAVar9 = *(Arena **)pAVar9;
    }
    pMVar6 = google::protobuf::Arena::
             CreateMaybeMessage<CoreML::Specification::MeanSquaredErrorLossLayer>(pAVar9);
    (pLVar5->LossLayerType_).meansquarederrorlosslayer_ = pMVar6;
  }
  uVar2 = (pMVar6->super_MessageLite)._internal_metadata_.ptr_;
  puVar8 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
  if ((uVar2 & 1) != 0) {
    puVar8 = (undefined8 *)*puVar8;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pMVar6->input_,mseInputName,puVar8)
  ;
  uVar2 = (pMVar6->super_MessageLite)._internal_metadata_.ptr_;
  puVar8 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
  if ((uVar2 & 1) != 0) {
    puVar8 = (undefined8 *)*puVar8;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pMVar6->target_,targetName,puVar8);
  pMVar10 = m->description_;
  if (pMVar10 == (ModelDescription *)0x0) {
    pMVar10 = (ModelDescription *)&CoreML::Specification::_ModelDescription_default_instance_;
  }
  if ((pMVar10->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x358);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_68,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=(&local_99,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_68);
  }
  CoreML::Specification::FeatureDescription::FeatureDescription
            (&local_98,
             (FeatureDescription *)((pMVar10->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]
            );
  pMVar10 = m->description_;
  if (pMVar10 == (ModelDescription *)0x0) {
    uVar2 = (m->super_MessageLite)._internal_metadata_.ptr_;
    pAVar9 = (Arena *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      pAVar9 = *(Arena **)pAVar9;
    }
    pMVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                        (pAVar9);
    m->description_ = pMVar10;
  }
  pRVar3 = (pMVar10->traininginput_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 != (Rep *)0x0) {
    iVar1 = (pMVar10->traininginput_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar1 < pRVar3->allocated_size) {
      (pMVar10->traininginput_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
      pFVar7 = (FeatureDescription *)pRVar3->elements[iVar1];
      goto LAB_0019f2d3;
    }
  }
  pFVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                     ((pMVar10->traininginput_).super_RepeatedPtrFieldBase.arena_);
  pFVar7 = (FeatureDescription *)
           google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                     (&(pMVar10->traininginput_).super_RepeatedPtrFieldBase,pFVar7);
LAB_0019f2d3:
  CoreML::Specification::FeatureDescription::CopyFrom(pFVar7,&local_98);
  uVar2 = (pFVar7->super_MessageLite)._internal_metadata_.ptr_;
  puVar8 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
  if ((uVar2 & 1) != 0) {
    puVar8 = (undefined8 *)*puVar8;
  }
  google::protobuf::internal::ArenaStringPtr::Set
            (&pFVar7->name_,(ulong)(pMVar6->target_).tagged_ptr_.ptr_ & 0xfffffffffffffffe,puVar8);
  CoreML::Specification::FeatureDescription::~FeatureDescription(&local_98);
  return;
}

Assistant:

void addMeanSquareError(Specification::Model& m, NeuralNetworkClass *nn, const char *lossName, const char *mseInputName, const char *targetName) {

    // set a MSE loss layer
    Specification::NetworkUpdateParameters *updateParams = nn->mutable_updateparams();
    Specification::LossLayer *lossLayer = updateParams->add_losslayers();
    lossLayer->set_name(lossName);
    Specification::MeanSquaredErrorLossLayer *mseLossLayer = lossLayer->mutable_meansquarederrorlosslayer();
    mseLossLayer->set_input(mseInputName);
    mseLossLayer->set_target(targetName);

    auto output = m.description().output(0);
    auto trainingInput = m.mutable_description()->mutable_traininginput()->Add();
    trainingInput->CopyFrom(output);
    trainingInput->set_name(mseLossLayer->target());

}